

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persncal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::PersianCalendar::handleComputeMonthStart
          (PersianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int32_t iVar1;
  int iVar2;
  int local_20;
  int32_t julianDay;
  int32_t iStack_14;
  UBool param_3_local;
  int32_t month_local;
  int32_t eyear_local;
  PersianCalendar *this_local;
  
  julianDay = month;
  iStack_14 = eyear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&julianDay);
    iStack_14 = iVar1 + iStack_14;
  }
  iVar2 = iStack_14 + -1;
  iVar1 = ClockMath::floorDivide(iStack_14 * 8 + 0x15,0x21);
  local_20 = iVar2 * 0x16d + 0x1dba9f + iVar1;
  if (julianDay != 0) {
    local_20 = kPersianNumDays[julianDay] + local_20;
  }
  return local_20;
}

Assistant:

int32_t PersianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /*useMonth*/) const {
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        eyear += ClockMath::floorDivide(month, 12, month);
    }

    int32_t julianDay = PERSIAN_EPOCH - 1 + 365 * (eyear - 1) + ClockMath::floorDivide(8 * eyear + 21, 33);

    if (month != 0) {
        julianDay += kPersianNumDays[month];
    }

    return julianDay;
}